

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall client_socket::impl::~impl(impl *this)

{
  impl *this_local;
  
  if (this->destroyed != (bool *)0x0) {
    *this->destroyed = true;
  }
  sysapi::epoll_registration::~epoll_registration(&this->reg);
  std::function<void_()>::~function(&this->on_write_ready);
  std::function<void_()>::~function(&this->on_read_ready);
  std::function<void_()>::~function(&this->on_disconnect);
  file_descriptor::~file_descriptor(&this->fd);
  return;
}

Assistant:

client_socket::impl::~impl()
{
    if (destroyed)
        *destroyed = true;
}